

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_input.hpp
# Opt level: O2

pair_t tao::pegtl::internal::peek_utf8::
       peek<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
                 (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *in)

{
  byte *pbVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  pbVar1 = (byte *)(in->
                   super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).
                   super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .m_current.data;
  uVar4 = (uint)*pbVar1;
  if (-1 < (char)*pbVar1) {
    uVar3 = 0x100000000;
    uVar2 = uVar4;
    goto LAB_0014aeed;
  }
  if ((uVar4 & 0xffffffe0) == 0xc0) {
    if (((1 < (ulong)((long)(in->
                            super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).
                            super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .m_end - (long)pbVar1)) && ((pbVar1[1] & 0xffffffc0) == 0x80)) &&
       (uVar2 = (uVar4 & 0x1f) << 6, 0x7f < uVar2)) {
      uVar2 = pbVar1[1] & 0x3f | uVar2;
      uVar3 = 0x200000000;
      goto LAB_0014aeed;
    }
  }
  else if ((uVar4 & 0xfffffff0) == 0xe0) {
    if (2 < (ulong)((long)(in->
                          super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).
                          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_end - (long)pbVar1)) {
      if (((pbVar1[2] & 0xffffffc0) == 0x80 && (pbVar1[1] & 0xc0) == 0x80) &&
         (uVar4 = pbVar1[1] & 0x3f | (uVar4 & 0xf) << 6, 0x1f < uVar4)) {
        uVar2 = pbVar1[2] & 0x3f | uVar4 << 6;
        uVar3 = 0x300000000;
        goto LAB_0014aeed;
      }
    }
  }
  else if (((uVar4 & 0xfffffff8) == 0xf0) &&
          (3 < (ulong)((long)(in->
                             super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ).
                             super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_end - (long)pbVar1))) {
    uVar2 = 0;
    if (((pbVar1[1] & 0xffffffc0) == 0x80) && ((pbVar1[2] & 0xffffffc0) == 0x80)) {
      uVar3 = 0;
      if ((pbVar1[3] & 0xffffffc0) != 0x80) goto LAB_0014aeed;
      uVar4 = (uVar4 & 7) * 0x40;
      uVar2 = pbVar1[1] & 0x3f;
      if ((uVar2 + uVar4) - 0x10 < 0x100) {
        uVar2 = pbVar1[3] & 0x3f | (pbVar1[2] & 0x3f) << 6 | (uVar2 | uVar4) << 0xc;
        uVar3 = 0x400000000;
        goto LAB_0014aeed;
      }
    }
  }
  uVar2 = 0;
  uVar3 = 0;
LAB_0014aeed:
  return (pair_t)(uVar2 | uVar3);
}

Assistant:

const char* current() const noexcept
            {
               return m_current.data;
            }